

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

duckdb_logical_type duckdb_create_enum_type(char **member_names,idx_t member_count)

{
  undefined8 in_RCX;
  idx_t i;
  idx_t iVar1;
  data_ptr_t pdVar2;
  string_t sVar3;
  LogicalType *local_e0;
  anon_union_16_2_67f50693_for_value local_d8;
  LogicalType local_c8;
  LogicalType local_b0;
  Vector enum_vector;
  
  if (member_names == (char **)0x0) {
    local_e0 = (LogicalType *)0x0;
  }
  else {
    duckdb::LogicalType::LogicalType(&local_c8,VARCHAR);
    duckdb::Vector::Vector(&enum_vector,&local_c8,member_count);
    duckdb::LogicalType::~LogicalType(&local_c8);
    pdVar2 = enum_vector.data + 8;
    local_e0 = (LogicalType *)0x0;
    for (iVar1 = 0; member_count != iVar1; iVar1 = iVar1 + 1) {
      if (member_names[iVar1] == (char *)0x0) goto LAB_00a0e90d;
      duckdb::string_t::string_t((string_t *)&local_d8.pointer,member_names[iVar1]);
      sVar3.value.pointer.ptr = (char *)in_RCX;
      sVar3.value._0_8_ = local_d8.pointer.ptr;
      sVar3 = duckdb::StringVector::AddStringOrBlob
                        ((StringVector *)&enum_vector,(Vector *)local_d8._0_8_,sVar3);
      *(long *)(pdVar2 + -8) = sVar3.value._0_8_;
      *(long *)pdVar2 = sVar3.value._8_8_;
      pdVar2 = pdVar2 + 0x10;
    }
    local_e0 = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(local_e0);
    duckdb::LogicalType::ENUM(&local_b0,&enum_vector,member_count);
    duckdb::LogicalType::operator=(local_e0,&local_b0);
    duckdb::LogicalType::~LogicalType(&local_b0);
LAB_00a0e90d:
    duckdb::Vector::~Vector(&enum_vector);
  }
  return (duckdb_logical_type)local_e0;
}

Assistant:

duckdb_logical_type duckdb_create_enum_type(const char **member_names, idx_t member_count) {
	if (!member_names) {
		return nullptr;
	}
	duckdb::Vector enum_vector(duckdb::LogicalType::VARCHAR, member_count);
	auto enum_vector_ptr = duckdb::FlatVector::GetData<duckdb::string_t>(enum_vector);

	for (idx_t i = 0; i < member_count; i++) {
		if (!member_names[i]) {
			return nullptr;
		}
		enum_vector_ptr[i] = duckdb::StringVector::AddStringOrBlob(enum_vector, member_names[i]);
	}

	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	*mtype = duckdb::LogicalType::ENUM(enum_vector, member_count);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}